

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

Result __thiscall
soplex::SPxMainSM<double>::duplicateCols(SPxMainSM<double> *this,SPxLPBase<double> *lp,bool *again)

{
  Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *this_00;
  int *piVar1;
  pointer pDVar2;
  uint _k;
  Nonzero<double> *pNVar3;
  Tolerances *pTVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer pdVar6;
  Item *pIVar7;
  DataKey *pDVar8;
  int *piVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  Result RVar13;
  long lVar14;
  DuplicateColsPS *pDVar15;
  FixBoundsPS *pFVar16;
  undefined8 extraout_RAX;
  SPxOut *pSVar17;
  long lVar18;
  pointer pDVar19;
  bool bVar20;
  double dVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  int iVar26;
  DSVectorBase<double> *this_01;
  bool bVar27;
  long lVar28;
  bool bVar29;
  long in_FS_OFFSET;
  double dVar30;
  double dVar31;
  Real RVar32;
  Real RVar33;
  double dVar34;
  undefined1 auVar35 [16];
  double dVar36;
  undefined1 auVar37 [16];
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar41;
  DataArray<int> da_perm;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr_6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_248;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_240;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_238;
  int *perm;
  double local_228;
  undefined8 uStack_220;
  long local_210;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_208;
  int *idxMem;
  element_type *local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  double local_1d8;
  undefined8 uStack_1d0;
  DataArray<bool> remCol;
  DataArray<int> pClass;
  double local_198;
  DataArray<bool> fixAndRemCol;
  Array<double> scale;
  DataArray<int> classSize;
  shared_ptr<soplex::Tolerances> local_130;
  shared_ptr<soplex::Tolerances> local_120;
  shared_ptr<soplex::Tolerances> local_110;
  shared_ptr<soplex::Tolerances> local_100;
  shared_ptr<soplex::Tolerances> local_f0;
  shared_ptr<soplex::Tolerances> local_e0;
  shared_ptr<soplex::Tolerances> local_d0;
  DataArray<int> m_perm_empty;
  DataArray<int> local_80;
  DataArray<int> local_68;
  undefined4 local_4c;
  DataArray<int> local_48;
  
  RVar13 = removeEmpty(this,lp);
  if (RVar13 == OKAY) {
    pClass.thesize = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
    RVar13 = OKAY;
    if (1 < pClass.thesize) {
      pClass.data = (int *)0x0;
      pClass.memFactor = 1.2;
      pClass.themax = pClass.thesize;
      spx_alloc<int*>(&pClass.data,pClass.thesize);
      iVar23 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      classSize.data = (int *)0x0;
      classSize.memFactor = 1.2;
      classSize.thesize = 0;
      if (0 < iVar23) {
        classSize.thesize = iVar23;
      }
      classSize.themax = 1;
      if (0 < iVar23) {
        classSize.themax = classSize.thesize;
      }
      spx_alloc<int*>(&classSize.data,classSize.themax);
      Array<double>::Array
                (&scale,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
      idxMem = (int *)0x0;
      spx_alloc<int*>(&idxMem,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
      piVar9 = idxMem;
      *pClass.data = 0;
      *scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start = 0.0;
      *classSize.data = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      iVar23 = 0;
      if (1 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
        lVar24 = 1;
        iVar23 = 0;
        do {
          pClass.data[lVar24] = 0;
          scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar24] = 0.0;
          classSize.data[lVar24] = 0;
          idxMem[lVar24 + -1] = (int)lVar24;
          lVar24 = lVar24 + 1;
          iVar23 = iVar23 + 1;
        } while (lVar24 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
      }
      if (0 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
        dVar21 = 0.0;
        local_198 = 0.0;
        do {
          pIVar7 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                   (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[(long)dVar21]
                   .idx;
          local_228 = dVar21;
          if (0 < (pIVar7->data).super_SVectorBase<double>.memused) {
            lVar24 = 8;
            lVar28 = 0;
            do {
              pNVar3 = (pIVar7->data).super_SVectorBase<double>.m_elem;
              local_1d8 = *(double *)((long)pNVar3 + lVar24 + -8);
              iVar26 = *(int *)((long)&pNVar3->val + lVar24);
              if ((scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar26] == 0.0) &&
                 (!NAN(scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar26]))) {
                scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar26] = local_1d8;
              }
              this_01 = (this->m_classSetCols).data.
                        super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + pClass.data[iVar26];
              local_1d8 = local_1d8 /
                          scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar26];
              DSVectorBase<double>::makeMem(this_01,1);
              if ((local_1d8 != 0.0) || (NAN(local_1d8))) {
                iVar41 = (this_01->super_SVectorBase<double>).memused;
                pNVar3 = (this_01->super_SVectorBase<double>).m_elem;
                pNVar3[iVar41].idx = iVar26;
                pNVar3[iVar41].val = local_1d8;
                (this_01->super_SVectorBase<double>).memused = iVar41 + 1;
              }
              piVar1 = classSize.data + pClass.data[iVar26];
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) {
                lVar18 = (long)iVar23;
                iVar23 = iVar23 + 1;
                piVar9[lVar18] = pClass.data[iVar26];
              }
              lVar28 = lVar28 + 1;
              lVar24 = lVar24 + 0x10;
            } while (lVar28 < (pIVar7->data).super_SVectorBase<double>.memused);
          }
          if (0 < (pIVar7->data).super_SVectorBase<double>.memused) {
            lVar24 = 0;
            do {
              iVar26 = pClass.data[(pIVar7->data).super_SVectorBase<double>.m_elem[lVar24].idx];
              if (0 < (this->m_classSetCols).data.
                      super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar26].super_SVectorBase<double>.
                      memused) {
                pTVar4 = (this->super_SPxSimplifier<double>)._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                p_Var5 = (this->super_SPxSimplifier<double>)._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                  }
                }
                remCol._0_8_ = Tolerances::epsilon(pTVar4);
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                }
                pDVar19 = (this->m_classSetCols).data.
                          super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                iVar41 = pDVar19[iVar26].super_SVectorBase<double>.memused;
                if (1 < iVar41) {
                  SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
                            (pDVar19[iVar26].super_SVectorBase<double>.m_elem,iVar41,
                             (ElementCompare *)&remCol,0,true);
                }
                iVar41 = *piVar9;
                lVar28 = (long)iVar23;
                iVar23 = iVar23 + -1;
                *piVar9 = piVar9[lVar28 + -1];
                pDVar19 = (this->m_classSetCols).data.
                          super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (0 < pDVar19[iVar26].super_SVectorBase<double>.memused) {
                  pDVar2 = pDVar19 + iVar26;
                  lVar28 = 0;
                  lVar18 = 0;
                  do {
                    if (lVar28 != 0) {
                      local_1d8 = *(double *)
                                   ((long)&((pDVar2->super_SVectorBase<double>).m_elem)->val +
                                   lVar28);
                      uStack_1d0 = 0;
                      dVar30 = epsZero(this);
                      uVar38 = (ulong)DAT_00601100;
                      dVar21 = (double)((ulong)local_1d8 & uVar38);
                      if ((double)((ulong)local_1d8 & uVar38) <= (double)((ulong)local_198 & uVar38)
                         ) {
                        dVar21 = (double)((ulong)local_198 & uVar38);
                      }
                      if (dVar21 <= 1.0) {
                        dVar21 = 1.0;
                      }
                      if (dVar30 < (double)((ulong)((local_1d8 - local_198) / dVar21) & uVar38)) {
                        iVar41 = *piVar9;
                        lVar14 = (long)iVar23;
                        iVar23 = iVar23 + -1;
                        *piVar9 = piVar9[lVar14 + -1];
                      }
                    }
                    pNVar3 = (this->m_classSetCols).data.
                             super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar26].
                             super_SVectorBase<double>.m_elem;
                    pClass.data[*(int *)((long)&pNVar3->idx + lVar28)] = iVar41;
                    classSize.data[iVar41] = classSize.data[iVar41] + 1;
                    local_198 = *(double *)((long)&pNVar3->val + lVar28);
                    lVar18 = lVar18 + 1;
                    pDVar19 = (this->m_classSetCols).data.
                              super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    pDVar2 = pDVar19 + iVar26;
                    lVar28 = lVar28 + 0x10;
                  } while (lVar18 < (pDVar2->super_SVectorBase<double>).memused);
                }
                pDVar19[iVar26].super_SVectorBase<double>.memused = 0;
              }
              lVar24 = lVar24 + 1;
            } while (lVar24 < (pIVar7->data).super_SVectorBase<double>.memused);
          }
          dVar21 = (double)((long)local_228 + 1);
        } while ((long)dVar21 <
                 (long)(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
      }
      free(idxMem);
      idxMem = (int *)0x0;
      remCol.themax = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      remCol.data = (bool *)0x0;
      remCol.memFactor = 1.2;
      remCol.thesize = remCol.themax;
      if (remCol.themax < 1) {
        remCol.themax = 1;
        remCol.thesize = 0;
      }
      spx_alloc<bool*>(&remCol.data,remCol.themax);
      fixAndRemCol.themax = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      fixAndRemCol.data = (bool *)0x0;
      fixAndRemCol.memFactor = 1.2;
      fixAndRemCol.thesize = fixAndRemCol.themax;
      if (fixAndRemCol.themax < 1) {
        fixAndRemCol.themax = 1;
        fixAndRemCol.thesize = 0;
      }
      spx_alloc<bool*>(&fixAndRemCol.data,fixAndRemCol.themax);
      auVar12 = _DAT_00601040;
      iVar23 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      if (0 < (long)iVar23) {
        pDVar19 = (this->m_dupCols).data.
                  super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar24 = (long)iVar23 + -1;
        auVar35._8_4_ = (int)lVar24;
        auVar35._0_8_ = lVar24;
        auVar35._12_4_ = (int)((ulong)lVar24 >> 0x20);
        lVar24 = 0;
        auVar35 = auVar35 ^ _DAT_00601040;
        auVar37 = _DAT_00601020;
        auVar39 = _DAT_00601030;
        do {
          auVar40 = auVar39 ^ auVar12;
          iVar26 = auVar35._4_4_;
          if ((bool)(~(auVar40._4_4_ == iVar26 && auVar35._0_4_ < auVar40._0_4_ ||
                      iVar26 < auVar40._4_4_) & 1)) {
            *(undefined4 *)((long)&(pDVar19->super_SVectorBase<double>).memused + lVar24) = 0;
          }
          if ((auVar40._12_4_ != auVar35._12_4_ || auVar40._8_4_ <= auVar35._8_4_) &&
              auVar40._12_4_ <= auVar35._12_4_) {
            *(undefined4 *)((long)&pDVar19[1].super_SVectorBase<double>.memused + lVar24) = 0;
          }
          auVar40 = auVar37 ^ auVar12;
          iVar41 = auVar40._4_4_;
          if (iVar41 <= iVar26 && (iVar41 != iVar26 || auVar40._0_4_ <= auVar35._0_4_)) {
            *(undefined4 *)((long)&pDVar19[2].super_SVectorBase<double>.memused + lVar24) = 0;
            *(undefined4 *)((long)&pDVar19[3].super_SVectorBase<double>.memused + lVar24) = 0;
          }
          lVar28 = auVar39._8_8_;
          auVar39._0_8_ = auVar39._0_8_ + 4;
          auVar39._8_8_ = lVar28 + 4;
          lVar28 = auVar37._8_8_;
          auVar37._0_8_ = auVar37._0_8_ + 4;
          auVar37._8_8_ = lVar28 + 4;
          lVar24 = lVar24 + 0x80;
        } while ((ulong)(iVar23 + 3U >> 2) << 7 != lVar24);
      }
      if (0 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
        lVar24 = 0;
        do {
          remCol.data[lVar24] = false;
          fixAndRemCol.data[lVar24] = false;
          DSVectorBase<double>::makeMem
                    ((this->m_dupCols).data.
                     super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + pClass.data[lVar24],1);
          lVar24 = lVar24 + 1;
        } while (lVar24 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
      }
      m_perm_empty.data = (int *)0x0;
      m_perm_empty.memFactor = 1.2;
      m_perm_empty.thesize = 0;
      m_perm_empty.themax = 1;
      spx_alloc<int*>(&m_perm_empty.data,1);
      iVar23 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      bVar29 = 0 < iVar23;
      if (iVar23 < 1) {
        bVar27 = false;
      }
      else {
        this_00 = &this->m_hist;
        local_1f8 = *(element_type **)(in_FS_OFFSET + -8);
        uStack_1f0 = 0;
        local_1e8._0_8_ = (ulong)local_1f8 ^ 0x8000000000000000;
        local_1e8._8_8_ = 0x8000000000000000;
        lVar24 = 0;
        bVar27 = false;
        do {
          pDVar19 = (this->m_dupCols).data.
                    super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          dVar21 = (double)(lVar24 * 0x20);
          local_210 = lVar24;
          if ((1 < pDVar19[lVar24].super_SVectorBase<double>.memused) &&
             (local_1d8 = dVar21,
             (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
             [(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey
              [(pDVar19[lVar24].super_SVectorBase<double>.m_elem)->idx].idx].data.
             super_SVectorBase<double>.memused != 1)) {
            if (!bVar27) {
              pDVar15 = (DuplicateColsPS *)operator_new(0x78);
              DataArray<int>::DataArray(&local_48,&m_perm_empty);
              local_d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (this->super_SPxSimplifier<double>)._tolerances.
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (this->super_SPxSimplifier<double>)._tolerances.
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
              if (local_d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              DuplicateColsPS::DuplicateColsPS(pDVar15,lp,0,0,1.0,&local_48,&local_d0,true,false);
              da_perm._0_8_ = pDVar15;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<soplex::SPxMainSM<double>::DuplicateColsPS*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&da_perm.data,pDVar15);
              if (local_d0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_d0.
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_48.data != (int *)0x0) {
                free(local_48.data);
                local_48.data = (int *)0x0;
              }
              std::
              vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
              ::push_back(&this_00->data,(value_type *)&da_perm);
              if (da_perm.data != (int *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)da_perm.data);
              }
              bVar27 = true;
            }
            iVar23 = *(int *)((long)&(((this->m_dupCols).data.
                                       super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_SVectorBase<double>).memused + (long)local_1d8);
            bVar20 = 0 < iVar23;
            if (0 < iVar23) {
              local_198 = 0.0;
              do {
                pDVar19 = (this->m_dupCols).data.
                          super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (0 < *(int *)((long)&(pDVar19->super_SVectorBase<double>).memused +
                                (long)local_1d8)) {
                  lVar24 = (long)&pDVar19->_vptr_DSVectorBase + (long)local_1d8;
                  lVar28 = 8;
                  lVar18 = 0;
                  do {
                    if (local_198 != (double)lVar18) {
                      uVar22 = *(uint *)(*(long *)(lVar24 + 8) + 8 + (long)local_198 * 0x10);
                      if (remCol.data[(int)uVar22] == false) {
                        _k = *(uint *)(*(long *)(lVar24 + 8) + lVar28);
                        if (remCol.data[(int)_k] == false) {
                          pdVar6 = (lp->super_LPColSetBase<double>).object.val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start;
                          dVar21 = pdVar6[(int)uVar22];
                          dVar30 = scale.data.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[(int)uVar22];
                          local_208 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                      scale.data.super__Vector_base<double,_std::allocator<double>_>
                                      ._M_impl.super__Vector_impl_data._M_start[(int)_k];
                          local_228 = pdVar6[(int)_k] * dVar30;
                          dVar31 = epsZero(this);
                          dVar30 = dVar30 / (double)local_208;
                          dVar21 = dVar21 - local_228 / (double)local_208;
                          if (ABS(dVar21) <= dVar31) {
                            dVar21 = (lp->super_LPColSetBase<double>).low.val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[(int)uVar22];
                            pTVar4 = (this->super_SPxSimplifier<double>)._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr;
                            local_208 = (this->super_SPxSimplifier<double>)._tolerances.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi;
                            if (local_208 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                local_208->_M_use_count = local_208->_M_use_count + 1;
                                UNLOCK();
                              }
                              else {
                                local_208->_M_use_count = local_208->_M_use_count + 1;
                              }
                            }
                            RVar32 = Tolerances::epsilon(pTVar4);
                            dVar31 = ABS(dVar21);
                            if (dVar31 <= 0.0) {
                              dVar31 = 0.0;
                            }
                            if (dVar31 <= 1.0) {
                              dVar31 = 1.0;
                            }
                            dVar21 = dVar21 / dVar31;
                            local_228 = (double)CONCAT44(local_228._4_4_,
                                                         (int)CONCAT71((int7)((ulong)extraout_RAX >>
                                                                             8),1));
                            if (RVar32 < dVar21) {
LAB_001f1b07:
                              bVar10 = false;
                              bVar11 = true;
                            }
                            else {
                              dVar31 = (lp->super_LPColSetBase<double>).up.val.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start[(int)uVar22];
                              pTVar4 = (this->super_SPxSimplifier<double>)._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                              local_238 = (this->super_SPxSimplifier<double>)._tolerances.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi;
                              if (local_238 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                              {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  local_238->_M_use_count = local_238->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  local_238->_M_use_count = local_238->_M_use_count + 1;
                                }
                              }
                              RVar33 = Tolerances::epsilon(pTVar4);
                              dVar36 = ABS(dVar31);
                              if (dVar36 <= 0.0) {
                                dVar36 = 0.0;
                              }
                              if (dVar36 <= 1.0) {
                                dVar36 = 1.0;
                              }
                              if (dVar31 / dVar36 <= -RVar33) goto LAB_001f1b07;
                              dVar31 = (lp->super_LPColSetBase<double>).low.val.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start[(int)_k];
                              pTVar4 = (this->super_SPxSimplifier<double>)._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                              local_240 = (this->super_SPxSimplifier<double>)._tolerances.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi;
                              if (local_240 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                              {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  local_240->_M_use_count = local_240->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  local_240->_M_use_count = local_240->_M_use_count + 1;
                                }
                              }
                              RVar33 = Tolerances::epsilon(pTVar4);
                              dVar36 = ABS(dVar31);
                              if (dVar36 <= 0.0) {
                                dVar36 = 0.0;
                              }
                              if (dVar36 <= 1.0) {
                                dVar36 = 1.0;
                              }
                              if (dVar31 / dVar36 <= RVar33) {
                                local_228 = (lp->super_LPColSetBase<double>).up.val.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start[(int)_k];
                                uStack_220 = 0;
                                pTVar4 = (this->super_SPxSimplifier<double>)._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr;
                                local_248 = (this->super_SPxSimplifier<double>)._tolerances.
                                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi;
                                if (local_248 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                   ) {
                                  if (__libc_single_threaded == '\0') {
                                    LOCK();
                                    local_248->_M_use_count = local_248->_M_use_count + 1;
                                    UNLOCK();
                                  }
                                  else {
                                    local_248->_M_use_count = local_248->_M_use_count + 1;
                                  }
                                }
                                RVar33 = Tolerances::epsilon(pTVar4);
                                dVar31 = ABS(local_228);
                                if (dVar31 <= 0.0) {
                                  dVar31 = 0.0;
                                }
                                if (dVar31 <= 1.0) {
                                  dVar31 = 1.0;
                                }
                                bVar10 = -RVar33 < local_228 / dVar31;
                                bVar11 = false;
                                local_228 = (double)((ulong)local_228 & 0xffffffff00000000);
                              }
                              else {
                                bVar11 = false;
                                bVar10 = false;
                              }
                            }
                            if ((local_228._0_1_ == '\0') &&
                               (local_248 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        (local_248);
                            }
                            if (!bVar11 &&
                                local_240 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        (local_240);
                            }
                            p_Var5 = local_208;
                            if ((dVar21 <= RVar32) &&
                               (local_238 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        (local_238);
                            }
                            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                            }
                            if (bVar10) {
                              pDVar15 = (DuplicateColsPS *)operator_new(0x78);
                              DataArray<int>::DataArray(&local_68,&m_perm_empty);
                              local_e0.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr = (this->super_SPxSimplifier<double>)._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                              local_e0.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi =
                                   (this->super_SPxSimplifier<double>)._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi;
                              if (local_e0.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  (local_e0.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_M_use_count =
                                       (local_e0.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  (local_e0.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_M_use_count =
                                       (local_e0.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_M_use_count + 1;
                                }
                              }
                              DuplicateColsPS::DuplicateColsPS
                                        (pDVar15,lp,uVar22,_k,dVar30,&local_68,&local_e0,false,false
                                        );
                              da_perm._0_8_ = pDVar15;
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                              __shared_count<soplex::SPxMainSM<double>::DuplicateColsPS*>
                                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&da_perm.data
                                         ,pDVar15);
                              if (local_e0.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (local_e0.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
                              }
                              if (local_68.data != (int *)0x0) {
                                free(local_68.data);
                                local_68.data = (int *)0x0;
                              }
                              std::
                              vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                              ::push_back(&this_00->data,(value_type *)&da_perm);
                              if (dVar30 <= 0.0) {
                                if (dVar30 < 0.0) {
                                  dVar21 = (lp->super_LPColSetBase<double>).low.val.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start[(int)_k];
                                  ::soplex::infinity::__tls_init();
                                  if ((dVar21 <= (double)local_1e8._0_8_) ||
                                     (dVar21 = (lp->super_LPColSetBase<double>).up.val.
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_start[(int)uVar22]
                                     , ::soplex::infinity::__tls_init(), (double)local_1f8 <= dVar21
                                     )) {
                                    ::soplex::infinity::__tls_init();
                                    ptr_6.
                                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr = (element_type *)local_1e8._0_8_;
                                    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                      [0x2a])(lp,(ulong)_k,&ptr_6,0);
                                  }
                                  else {
                                    ptr_6.
                                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr = (element_type *)
                                              ((lp->super_LPColSetBase<double>).up.val.
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_start[(int)uVar22]
                                               * dVar30 +
                                              (lp->super_LPColSetBase<double>).low.val.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start[(int)_k]);
                                    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                      [0x2a])(lp,(ulong)_k,&ptr_6,0);
                                  }
                                  dVar21 = (lp->super_LPColSetBase<double>).up.val.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start[(int)_k];
                                  ::soplex::infinity::__tls_init();
                                  if (dVar21 < (double)local_1f8) {
                                    dVar21 = (lp->super_LPColSetBase<double>).low.val.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start[(int)uVar22];
                                    ::soplex::infinity::__tls_init();
                                    if ((double)local_1e8._0_8_ < dVar21) {
                                      ptr_6.
                                      super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr = (element_type *)
                                                (dVar30 * (lp->super_LPColSetBase<double>).low.val.
                                                                                                                    
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(int)uVar22] +
                                                (lp->super_LPColSetBase<double>).up.val.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start[(int)_k]);
                                      (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                        [0x2d])(lp,(ulong)_k,&ptr_6,0);
                                      goto LAB_001f2039;
                                    }
                                  }
                                  ::soplex::infinity::__tls_init();
                                  ptr_6.
                                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr = local_1f8;
                                  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                    [0x2d])(lp,(ulong)_k,&ptr_6,0);
                                }
                              }
                              else {
                                dVar21 = (lp->super_LPColSetBase<double>).low.val.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[(int)_k];
                                ::soplex::infinity::__tls_init();
                                if (dVar21 <= (double)local_1e8._0_8_) {
LAB_001f1e06:
                                  ::soplex::infinity::__tls_init();
                                  ptr_6.
                                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr = (element_type *)local_1e8._0_8_;
                                  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                    [0x2a])(lp,(ulong)_k,&ptr_6,0);
                                }
                                else {
                                  dVar21 = (lp->super_LPColSetBase<double>).low.val.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start[(int)uVar22];
                                  ::soplex::infinity::__tls_init();
                                  if (dVar21 <= (double)local_1e8._0_8_) goto LAB_001f1e06;
                                  pdVar6 = (lp->super_LPColSetBase<double>).low.val.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start;
                                  ptr_6.
                                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr = (element_type *)
                                            (pdVar6[(int)uVar22] * dVar30 + pdVar6[(int)_k]);
                                  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                    [0x2a])(lp,(ulong)_k,&ptr_6,0);
                                }
                                dVar21 = (lp->super_LPColSetBase<double>).up.val.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[(int)_k];
                                ::soplex::infinity::__tls_init();
                                if (((double)local_1f8 <= dVar21) ||
                                   (dVar21 = (lp->super_LPColSetBase<double>).up.val.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start[(int)uVar22],
                                   ::soplex::infinity::__tls_init(), (double)local_1f8 <= dVar21)) {
                                  ::soplex::infinity::__tls_init();
                                  ptr_6.
                                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr = local_1f8;
                                  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                    [0x2d])(lp,(ulong)_k,&ptr_6,0);
                                }
                                else {
                                  pdVar6 = (lp->super_LPColSetBase<double>).up.val.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start;
                                  ptr_6.
                                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr = (element_type *)
                                            (dVar30 * pdVar6[(int)uVar22] + pdVar6[(int)_k]);
                                  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                    [0x2d])(lp,(ulong)_k,&ptr_6,0);
                                }
                              }
LAB_001f2039:
                              remCol.data[(int)uVar22] = true;
                              piVar9 = (this->m_stat).data + 0xe;
                              *piVar9 = *piVar9 + 1;
                              if (da_perm.data != (int *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                           da_perm.data);
                              }
                            }
                          }
                          else {
                            local_228 = (lp->super_LPColSetBase<double>).low.val.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start[(int)_k];
                            ::soplex::infinity::__tls_init();
                            if (local_228 <= (double)local_1e8._0_8_) {
                              if ((dVar30 <= 0.0) || (dVar21 <= 0.0)) {
                                if ((dVar30 < 0.0) && (dVar21 < 0.0)) {
                                  dVar21 = (lp->super_LPColSetBase<double>).low.val.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start[(int)uVar22];
                                  ::soplex::infinity::__tls_init();
                                  if ((double)local_1e8._0_8_ < dVar21) {
                                    pdVar6 = (lp->super_LPColSetBase<double>).low.val.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start;
                                    pFVar16 = (FixBoundsPS *)operator_new(0x30);
                                    dVar21 = pdVar6[(int)uVar22];
                                    local_100.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr = (this->super_SPxSimplifier<double>)._tolerances.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr;
                                    local_100.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi =
                                         (this->super_SPxSimplifier<double>)._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi;
                                    if (local_100.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi !=
                                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                      if (__libc_single_threaded == '\0') {
                                        LOCK();
                                        (local_100.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi)->_M_use_count =
                                             (local_100.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_M_use_count + 1;
                                        UNLOCK();
                                      }
                                      else {
                                        (local_100.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi)->_M_use_count =
                                             (local_100.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_M_use_count + 1;
                                      }
                                    }
                                    FixBoundsPS::FixBoundsPS(pFVar16,lp,uVar22,dVar21,&local_100);
                                    da_perm._0_8_ = pFVar16;
                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                    __shared_count<soplex::SPxMainSM<double>::FixBoundsPS*>
                                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                               &da_perm.data,pFVar16);
                                    if (local_100.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi !=
                                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                                (local_100.
                                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount._M_pi);
                                    }
                                    std::
                                    vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                                    ::push_back(&this_00->data,(value_type *)&da_perm);
                                    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                      [0x2d])(lp,(ulong)uVar22,
                                              (lp->super_LPColSetBase<double>).low.val.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start + (int)uVar22
                                              ,0);
                                    goto joined_r0x001f225c;
                                  }
                                  goto LAB_001f2473;
                                }
                              }
                              else {
                                dVar21 = (lp->super_LPColSetBase<double>).up.val.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[(int)uVar22];
                                ::soplex::infinity::__tls_init();
                                if ((double)local_1f8 <= dVar21) {
LAB_001f2473:
                                  if (!bVar20) goto LAB_001f2455;
                                  goto LAB_001f2494;
                                }
                                pdVar6 = (lp->super_LPColSetBase<double>).up.val.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start;
                                pFVar16 = (FixBoundsPS *)operator_new(0x30);
                                dVar21 = pdVar6[(int)uVar22];
                                local_f0.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr = (this->super_SPxSimplifier<double>)._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr;
                                local_f0.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi =
                                     (this->super_SPxSimplifier<double>)._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi;
                                if (local_f0.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  if (__libc_single_threaded == '\0') {
                                    LOCK();
                                    (local_f0.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi)->_M_use_count =
                                         (local_f0.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_M_use_count + 1;
                                    UNLOCK();
                                  }
                                  else {
                                    (local_f0.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi)->_M_use_count =
                                         (local_f0.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_M_use_count + 1;
                                  }
                                }
                                FixBoundsPS::FixBoundsPS(pFVar16,lp,uVar22,dVar21,&local_f0);
                                da_perm._0_8_ = pFVar16;
                                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                __shared_count<soplex::SPxMainSM<double>::FixBoundsPS*>
                                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                           &da_perm.data,pFVar16);
                                if (local_f0.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                            (local_f0.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi);
                                }
                                std::
                                vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                                ::push_back(&this_00->data,(value_type *)&da_perm);
                                (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                  super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2a])
                                          (lp,(ulong)uVar22,
                                           (lp->super_LPColSetBase<double>).up.val.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start + (int)uVar22,0)
                                ;
joined_r0x001f225c:
                                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)da_perm.data !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                             da_perm.data);
                                }
                              }
                            }
                            else {
                              local_228 = (lp->super_LPColSetBase<double>).up.val.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start[(int)_k];
                              ::soplex::infinity::__tls_init();
                              if ((double)local_1f8 <= local_228) {
                                if ((0.0 <= dVar30) || (dVar21 <= 0.0)) {
                                  if ((dVar30 <= 0.0) || (0.0 <= dVar21)) goto LAB_001f2375;
                                  dVar21 = (lp->super_LPColSetBase<double>).low.val.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start[(int)uVar22];
                                  ::soplex::infinity::__tls_init();
                                  if ((double)local_1e8._0_8_ < dVar21) {
                                    pdVar6 = (lp->super_LPColSetBase<double>).low.val.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start;
                                    pFVar16 = (FixBoundsPS *)operator_new(0x30);
                                    dVar21 = pdVar6[(int)uVar22];
                                    local_120.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr = (this->super_SPxSimplifier<double>)._tolerances.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr;
                                    local_120.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi =
                                         (this->super_SPxSimplifier<double>)._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi;
                                    if (local_120.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi !=
                                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                      if (__libc_single_threaded == '\0') {
                                        LOCK();
                                        (local_120.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi)->_M_use_count =
                                             (local_120.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_M_use_count + 1;
                                        UNLOCK();
                                      }
                                      else {
                                        (local_120.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi)->_M_use_count =
                                             (local_120.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_M_use_count + 1;
                                      }
                                    }
                                    FixBoundsPS::FixBoundsPS(pFVar16,lp,uVar22,dVar21,&local_120);
                                    da_perm._0_8_ = pFVar16;
                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                    __shared_count<soplex::SPxMainSM<double>::FixBoundsPS*>
                                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                               &da_perm.data,pFVar16);
                                    if (local_120.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi !=
                                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                                (local_120.
                                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount._M_pi);
                                    }
                                    std::
                                    vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                                    ::push_back(&this_00->data,(value_type *)&da_perm);
                                    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                      [0x2d])(lp,(ulong)uVar22,
                                              (lp->super_LPColSetBase<double>).low.val.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start + (int)uVar22
                                              ,0);
                                    goto joined_r0x001f225c;
                                  }
                                }
                                else {
                                  dVar21 = (lp->super_LPColSetBase<double>).up.val.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start[(int)uVar22];
                                  ::soplex::infinity::__tls_init();
                                  if (dVar21 < (double)local_1f8) {
                                    pdVar6 = (lp->super_LPColSetBase<double>).up.val.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start;
                                    pFVar16 = (FixBoundsPS *)operator_new(0x30);
                                    dVar21 = pdVar6[(int)uVar22];
                                    local_110.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr = (this->super_SPxSimplifier<double>)._tolerances.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr;
                                    local_110.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi =
                                         (this->super_SPxSimplifier<double>)._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi;
                                    if (local_110.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi !=
                                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                      if (__libc_single_threaded == '\0') {
                                        LOCK();
                                        (local_110.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi)->_M_use_count =
                                             (local_110.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_M_use_count + 1;
                                        UNLOCK();
                                      }
                                      else {
                                        (local_110.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi)->_M_use_count =
                                             (local_110.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_M_use_count + 1;
                                      }
                                    }
                                    FixBoundsPS::FixBoundsPS(pFVar16,lp,uVar22,dVar21,&local_110);
                                    da_perm._0_8_ = pFVar16;
                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                    __shared_count<soplex::SPxMainSM<double>::FixBoundsPS*>
                                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                               &da_perm.data,pFVar16);
                                    if (local_110.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi !=
                                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                                (local_110.
                                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount._M_pi);
                                    }
                                    std::
                                    vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                                    ::push_back(&this_00->data,(value_type *)&da_perm);
                                    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                      [0x2a])(lp,(ulong)uVar22,
                                              (lp->super_LPColSetBase<double>).up.val.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start + (int)uVar22
                                              ,0);
                                    goto joined_r0x001f225c;
                                  }
                                }
                                goto LAB_001f2473;
                              }
                            }
LAB_001f2375:
                            dVar21 = (lp->super_LPColSetBase<double>).low.val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[(int)uVar22];
                            dVar30 = (lp->super_LPColSetBase<double>).up.val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[(int)uVar22];
                            dVar34 = feastol(this);
                            uVar38 = (ulong)DAT_00601100;
                            dVar36 = (double)((ulong)dVar21 & uVar38);
                            dVar31 = (double)((ulong)dVar30 & uVar38);
                            if (dVar36 <= dVar31) {
                              dVar36 = dVar31;
                            }
                            if (dVar36 <= 1.0) {
                              dVar36 = 1.0;
                            }
                            if ((double)((ulong)((dVar21 - dVar30) / dVar36) & uVar38) <= dVar34) {
                              remCol.data[(int)uVar22] = true;
                              fixAndRemCol.data[(int)uVar22] = true;
                              piVar9 = (this->m_stat).data + 0xd;
                              *piVar9 = *piVar9 + 1;
                            }
                          }
                        }
                      }
                    }
                    lVar18 = lVar18 + 1;
                    lVar24 = (long)&((this->m_dupCols).data.
                                     super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_vptr_DSVectorBase
                             + (long)local_1d8;
                    lVar28 = lVar28 + 0x10;
                  } while (lVar18 < *(int *)(lVar24 + 0x14));
                }
                local_198 = (double)((long)local_198 + 1);
                lVar24 = (long)*(int *)((long)&(((this->m_dupCols).data.
                                                 super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               super_SVectorBase<double>).memused + (long)local_1d8)
                ;
                bVar20 = (long)local_198 < lVar24;
              } while ((long)local_198 < lVar24);
            }
          }
LAB_001f2455:
          lVar24 = local_210 + 1;
          lVar28 = (long)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
          bVar29 = lVar24 < lVar28;
        } while (lVar24 < lVar28);
      }
LAB_001f2494:
      RVar13 = UNBOUNDED;
      if (!bVar29) {
        uVar22 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
        if (0 < (int)uVar22) {
          lVar24 = 0;
          do {
            if (fixAndRemCol.data[lVar24] == true) {
              fixColumn(this,lp,(int)lVar24,false);
            }
            lVar24 = lVar24 + 1;
            uVar22 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
          } while (lVar24 < (int)uVar22);
        }
        perm = (int *)0x0;
        spx_alloc<int*>(&perm,uVar22);
        uVar38 = (ulong)uVar22;
        if ((int)uVar22 < 1) {
          iVar26 = 0;
          iVar23 = 0;
        }
        else {
          pIVar7 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
          pDVar8 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey;
          uVar25 = 0;
          iVar23 = 0;
          iVar26 = 0;
          do {
            if (remCol.data[uVar25] == true) {
              perm[uVar25] = -1;
              iVar23 = iVar23 + 1;
              iVar26 = iVar26 + pIVar7[pDVar8[uVar25].idx].data.super_SVectorBase<double>.memused;
            }
            else {
              perm[uVar25] = 0;
            }
            uVar25 = uVar25 + 1;
          } while (uVar38 != uVar25);
        }
        (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x17])(lp,perm);
        if (0 < (int)uVar22) {
          piVar9 = (this->m_cIdx).data;
          uVar25 = 0;
          do {
            if (-1 < (long)perm[uVar25]) {
              piVar9[perm[uVar25]] = piVar9[uVar25];
            }
            uVar25 = uVar25 + 1;
          } while (uVar38 != uVar25);
        }
        da_perm.data = (int *)0x0;
        da_perm.memFactor = 1.2;
        da_perm.thesize = 0;
        if (0 < (int)uVar22) {
          da_perm.thesize = uVar22;
        }
        da_perm.themax = 1;
        if (0 < (int)uVar22) {
          da_perm.themax = da_perm.thesize;
        }
        spx_alloc<int*>(&da_perm.data,da_perm.themax);
        if (0 < (int)uVar22) {
          uVar25 = 0;
          do {
            da_perm.data[uVar25] = perm[uVar25];
            uVar25 = uVar25 + 1;
          } while (uVar38 != uVar25);
        }
        if (bVar27) {
          pDVar15 = (DuplicateColsPS *)operator_new(0x78);
          DataArray<int>::DataArray(&local_80,&da_perm);
          local_130.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (this->super_SPxSimplifier<double>)._tolerances.
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_130.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (this->super_SPxSimplifier<double>)._tolerances.
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
          if (local_130.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_130.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_130.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_130.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_130.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          DuplicateColsPS::DuplicateColsPS(pDVar15,lp,0,0,1.0,&local_80,&local_130,false,true);
          ptr_6.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)pDVar15;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<soplex::SPxMainSM<double>::DuplicateColsPS*>
                    (&ptr_6.
                      super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,pDVar15);
          if (local_130.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_130.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_80.data != (int *)0x0) {
            free(local_80.data);
            local_80.data = (int *)0x0;
          }
          std::
          vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
          ::push_back(&(this->m_hist).data,&ptr_6);
          if (ptr_6.
              super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (ptr_6.
                       super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        free(perm);
        perm = (int *)0x0;
        if (0 < iVar23) {
          piVar9 = &(this->super_SPxSimplifier<double>).m_remCols;
          *piVar9 = *piVar9 + iVar23;
          piVar9 = &(this->super_SPxSimplifier<double>).m_remNzos;
          *piVar9 = *piVar9 + iVar26;
          pSVar17 = (this->super_SPxSimplifier<double>).spxout;
          if ((pSVar17 != (SPxOut *)0x0) && (3 < (int)pSVar17->m_verbosity)) {
            ptr_6.
            super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)
                     CONCAT44(ptr_6.
                              super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._4_4_,pSVar17->m_verbosity);
            local_4c = 4;
            (*pSVar17->_vptr_SPxOut[2])();
            pSVar17 = soplex::operator<<((this->super_SPxSimplifier<double>).spxout,
                                         "Simplifier (duplicate columns) removed ");
            std::ostream::operator<<((ostream *)pSVar17->m_streams[pSVar17->m_verbosity],iVar23);
            pSVar17 = soplex::operator<<(pSVar17," cols, ");
            std::ostream::operator<<((ostream *)pSVar17->m_streams[pSVar17->m_verbosity],iVar26);
            pSVar17 = soplex::operator<<(pSVar17," non-zeros");
            std::endl<char,std::char_traits<char>>(pSVar17->m_streams[pSVar17->m_verbosity]);
            pSVar17 = (this->super_SPxSimplifier<double>).spxout;
            (*pSVar17->_vptr_SPxOut[2])(pSVar17,&ptr_6);
          }
          if ((double)(int)uVar22 * (this->super_SPxSimplifier<double>).m_minReduction <
              (double)iVar23) {
            *again = true;
          }
        }
        if (da_perm.data != (int *)0x0) {
          free(da_perm.data);
          da_perm.data = (int *)0x0;
        }
        RVar13 = OKAY;
      }
      if (m_perm_empty.data != (int *)0x0) {
        free(m_perm_empty.data);
        m_perm_empty.data = (int *)0x0;
      }
      if (fixAndRemCol.data != (bool *)0x0) {
        free(fixAndRemCol.data);
        fixAndRemCol.data = (bool *)0x0;
      }
      if (remCol.data != (bool *)0x0) {
        free(remCol.data);
        remCol.data = (bool *)0x0;
      }
      if (scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (classSize.data != (int *)0x0) {
        free(classSize.data);
        classSize.data = (int *)0x0;
      }
      if (pClass.data != (int *)0x0) {
        free(pClass.data);
      }
    }
  }
  return RVar13;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateCols(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate columns
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   int remCols = 0;
   int remNzos = 0;

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

   if(lp.nCols() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nCols());          // class of parallel columns
   DataArray<int>    classSize(lp.nCols());       // size of each class
   Array<R>   scale(lp.nCols());           // scaling factor for each column
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nCols());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nCols(), idxMem);  // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nCols();

   for(int j = 1; j < lp.nCols(); ++j)
   {
      pClass[j] = 0;
      scale[j]  = 0.0;
      classSize[j] = 0;
      idxSet.addIdx(j);
   }

   R oldVal = 0.0;

   // main loop
   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      for(int k = 0; k < row.size(); ++k)
      {
         R aij = row.value(k);
         int  j   = row.index(k);

         if(scale[j] == 0.0)
            scale[j] = aij;

         m_classSetCols[pClass[j]].add(j, aij / scale[j]);

         if(--classSize[pClass[j]] == 0)
            idxSet.addIdx(pClass[j]);
      }

      // update each parallel class with non-zero row entry
      for(int m = 0; m < row.size(); ++m)
      {
         int k = pClass[row.index(m)];

         if(m_classSetCols[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled row values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetCols[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetCols[k].hasNaNs());
               assert(!m_classSetCols[k].hasInfs());
               SPxQuicksort(m_classSetCols[k].mem(), m_classSetCols[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetCols[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetCols[k].value(l), oldVal, this->epsZero()))
               {
                  // start new parallel class
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetCols[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetCols[k].value(l);
            }

            m_classSetCols[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remCol(lp.nCols());
   DataArray<bool> fixAndRemCol(lp.nCols());

   for(int k = 0; k < lp.nCols(); ++k)
      m_dupCols[k].clear();

   for(int k = 0; k < lp.nCols(); ++k)
   {
      remCol[k] = false;
      fixAndRemCol[k] = false;
      m_dupCols[pClass[k]].add(k, 0.0);
   }

   bool hasDuplicateCol = false;
   DataArray<int>  m_perm_empty(0);

   for(int k = 0; k < lp.nCols(); ++k)
   {
      if(m_dupCols[k].size() > 1 && !(lp.colVector(m_dupCols[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM58 {} duplicate columns found\n", m_dupCols[k].size());

         if(!hasDuplicateCol)
         {
            std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, m_perm_empty, this->_tolerances,
                                          true));
            m_hist.append(ptr);
            hasDuplicateCol = true;
         }

         for(int l = 0; l < m_dupCols[k].size(); ++l)
         {
            for(int m = 0; m < m_dupCols[k].size(); ++m)
            {
               int j1  = m_dupCols[k].index(l);
               int j2  = m_dupCols[k].index(m);

               if(l != m && !remCol[j1] && !remCol[j2])
               {
                  R cj1 = lp.maxObj(j1);
                  R cj2 = lp.maxObj(j2);

                  // A.j1 = factor * A.j2
                  R factor = scale[j1] / scale[j2];
                  R objDif = cj1 - cj2 * scale[j1] / scale[j2];

                  SOPLEX_ASSERT_WARN("WMAISM59", isNotZero(factor, this->epsZero()));

                  if(isZero(objDif, this->epsZero()))
                  {
                     // case 1: objectives also duplicate

                     // if 0 is not within the column bounds, we are not able to postsolve if the aggregated column has
                     // status ZERO, hence we skip this case
                     if(LErel(lp.lower(j1), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j1), R(0.0), this->tolerances()->epsilon())
                           && LErel(lp.lower(j2), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j2), R(0.0), this->tolerances()->epsilon()))
                     {
                        std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, j1, j2, factor, m_perm_empty,
                                                      this->_tolerances));
                        // variable substitution xj2' := xj2 + factor * xj1 <=> xj2 = -factor * xj1 + xj2'
                        m_hist.append(ptr);

                        // update bounds of remaining column j2 (new column j2')
                        if(factor > 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.lower(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.upper(j1));
                        }
                        else if(factor < 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.upper(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.lower(j1));
                        }

                        SPxOut::debug(this, "IMAISM60 two duplicate columns {}, {} replaced by one\n", j1, j2);

                        remCol[j1] = true;

                        ++m_stat[SUB_DUPLICATE_COL];
                     }
                     else
                     {
                        SPxOut::debug(this,
                                      "IMAISM80 not removing two duplicate columns {}, {} because zero not contained in their bounds\n",
                                      j1, j2);
                     }
                  }
                  else
                  {
                     // case 2: objectives not duplicate
                     // considered for maximization sense
                     if(lp.lower(j2) <= R(-infinity))
                     {
                        if(factor > 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM75 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM61 two duplicate columns {}, {} first one fixed at upper bound={}\n", j1,
                                         j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }
                        else if(factor < 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM76 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM62 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }
                     else if(lp.upper(j2) >= R(infinity))
                     {
                        // fix j1 at upper bound
                        if(factor < 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM77 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM63 two duplicate columns {}, {},  first one fixed at upper bound={}\n",
                                         j1, j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }

                        // fix j1 at lower bound
                        else if(factor > 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM78 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM64 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }

                     if(EQrel(lp.lower(j1), lp.upper(j1), feastol()))
                     {
                        remCol[j1] = true;
                        fixAndRemCol[j1] = true;

                        ++m_stat[FIX_DUPLICATE_COL];
                     }
                  }
               }
            }
         }
      }
   }

   for(int j = 0; j < lp.nCols(); ++j)
   {
      if(fixAndRemCol[j])
      {
         assert(remCol[j]);

         // correctIdx == false, because the index mapping will be handled by the postsolving in DuplicateColsPS
         fixColumn(lp, j, false);
      }
   }

   // remove all columns by one single method call (more efficient)
   const int nColsOld = lp.nCols();
   int* perm = nullptr;
   spx_alloc(perm, nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(remCol[j])
      {
         perm[j] = -1;
         ++remCols;
         remNzos += lp.colVector(j).size();
      }
      else
         perm[j] = 0;
   }

   lp.removeCols(perm);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(perm[j] >= 0)
         m_cIdx[perm[j]] = m_cIdx[j];
   }

   DataArray<int> da_perm(nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      da_perm[j] = perm[j];
   }

   if(hasDuplicateCol)
   {
      std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, da_perm, this->_tolerances, false,
                                    true));
      m_hist.append(ptr);
   }

   spx_free(perm);

   assert(remCols > 0 || remNzos == 0);

   if(remCols > 0)
   {
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate columns) removed "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols > this->m_minReduction * nColsOld)
         again = true;
   }

   return this->OKAY;
}